

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginApplyRequests(ImGuiTable *table)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumn *pIVar5;
  char *pcVar6;
  long in_RDI;
  int n;
  int column_n;
  int order_n;
  int dst_order;
  int src_order;
  ImGuiTableColumn *dst_column;
  ImGuiTableColumn *src_column;
  int reorder_dir;
  long in_stack_ffffffffffffff98;
  int iVar7;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 in_stack_ffffffffffffffe0;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (*(short *)(in_RDI + 0x78) == 0) {
    if ((*(char *)(in_RDI + 0x237) != -1) &&
       ((*(float *)(in_RDI + 0xe0) != 3.4028235e+38 || (NAN(*(float *)(in_RDI + 0xe0)))))) {
      TableSetColumnWidth((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                          (float)in_stack_ffffffffffffffe0);
    }
    *(undefined1 *)(in_RDI + 0x238) = *(undefined1 *)(in_RDI + 0x237);
    *(undefined4 *)(in_RDI + 0xe0) = 0x7f7fffff;
    *(undefined1 *)(in_RDI + 0x237) = 0xff;
    if (*(char *)(in_RDI + 0x236) != -1) {
      ImSpan<ImGuiTableColumn>::operator[]
                ((ImSpan<ImGuiTableColumn> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
      TableSetColumnWidth((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                          (float)in_stack_ffffffffffffffe0);
      *(undefined1 *)(in_RDI + 0x236) = 0xff;
    }
  }
  if (*(short *)(in_RDI + 0x78) == 0) {
    if ((*(char *)(in_RDI + 0x239) == -1) && (*(char *)(in_RDI + 0x23a) != -1)) {
      *(undefined1 *)(in_RDI + 0x23a) = 0xff;
    }
    *(undefined1 *)(in_RDI + 0x239) = 0xff;
    if ((*(char *)(in_RDI + 0x23a) != -1) && (*(char *)(in_RDI + 0x23b) != '\0')) {
      cVar1 = *(char *)(in_RDI + 0x23b);
      iVar3 = (int)cVar1;
      if (iVar3 != -1 && iVar3 != 1) {
        __assert_fail("reorder_dir == -1 || reorder_dir == +1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x24d,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
      }
      if ((*(uint *)(in_RDI + 4) & 2) == 0) {
        __assert_fail("table->Flags & ImGuiTableFlags_Reorderable",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x24e,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
      }
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
      pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
      local_2c = (int)pIVar4->DisplayOrder;
      cVar2 = pIVar5->DisplayOrder;
      pIVar4->DisplayOrder = cVar2;
      while (local_2c = local_2c + iVar3, local_2c != cVar2 + iVar3) {
        ImSpan<signed_char>::operator[]
                  ((ImSpan<signed_char> *)
                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
        pIVar4->DisplayOrder = pIVar4->DisplayOrder - cVar1;
      }
      if ((int)pIVar5->DisplayOrder != cVar2 - iVar3) {
        __assert_fail("dst_column->DisplayOrder == dst_order - reorder_dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,599,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
      }
      for (local_30 = 0; iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
          local_30 < *(int *)(in_RDI + 0x6c); local_30 = local_30 + 1) {
        in_stack_ffffffffffffffa7 = (char)local_30;
        in_stack_ffffffffffffff98 = in_RDI + 0x20;
        iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        ImSpan<ImGuiTableColumn>::operator[]
                  ((ImSpan<ImGuiTableColumn> *)
                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
        pcVar6 = ImSpan<signed_char>::operator[]
                           ((ImSpan<signed_char> *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
        *pcVar6 = in_stack_ffffffffffffffa7;
      }
      *(undefined1 *)(in_RDI + 0x23b) = 0;
      *(undefined1 *)(in_RDI + 0x250) = 1;
    }
  }
  if ((*(byte *)(in_RDI + 0x253) & 1) != 0) {
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x6c); local_34 = local_34 + 1) {
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
      pIVar4->DisplayOrder = (ImGuiTableColumnIdx)local_34;
      pcVar6 = ImSpan<signed_char>::operator[]
                         ((ImSpan<signed_char> *)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),iVar7);
      *pcVar6 = (ImGuiTableColumnIdx)local_34;
    }
    *(undefined1 *)(in_RDI + 0x253) = 0;
    *(undefined1 *)(in_RDI + 0x250) = 1;
  }
  return;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}